

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O2

ostream * KokkosTools::ChromeTracing::operator<<(ostream *os,StackKind kind)

{
  if (kind < (STACK_COPY|STACK_REDUCE)) {
    std::operator<<(os,&DAT_0010523c + *(int *)(&DAT_0010523c + (ulong)kind * 4));
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, StackKind kind) {
  switch (kind) {
    case STACK_FOR: os << "[for]"; break;
    case STACK_REDUCE: os << "[reduce]"; break;
    case STACK_SCAN: os << "[scan]"; break;
    case STACK_REGION: os << "[region]"; break;
    case STACK_COPY: os << "[copy]"; break;
  };
  return os;
}